

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar1 = Consume(this,"service");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&local_40,service_location,1);
    LocationRecorder::RecordLegacyLocation(&local_40,&service->super_Message,NAME);
    *(byte *)(service->_has_bits_).has_bits_ = (byte)(service->_has_bits_).has_bits_[0] | 1;
    if ((service->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&service->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    bVar1 = ConsumeIdentifier(this,(service->name_).ptr_,"Expected service name.");
    LocationRecorder::~LocationRecorder(&local_40);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location,containing_file);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service,
    const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        service, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}